

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O1

void __thiscall CaptureSummary::~CaptureSummary(CaptureSummary *this)

{
  pointer pp_Var1;
  ulong uVar2;
  
  pp_Var1 = (this->summary).super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->summary).super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_finish != pp_Var1) {
    uVar2 = 0;
    do {
      if (pp_Var1[uVar2] != (_capture_line *)0x0) {
        operator_delete(pp_Var1[uVar2]);
        (this->summary).super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar2] = (_capture_line *)0x0;
      }
      uVar2 = uVar2 + 1;
      pp_Var1 = (this->summary).
                super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->summary).
                                   super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pp_Var1 >> 3))
    ;
  }
  if (pp_Var1 != (pointer)0x0) {
    operator_delete(pp_Var1);
    return;
  }
  return;
}

Assistant:

CaptureSummary::~CaptureSummary()
{
    for (size_t i = 0; i < summary.size(); i++)
    {
        if (summary[i] != NULL)
        {
            delete summary[i];
            summary[i] = NULL;
        }
    }
}